

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O3

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,FuncCallArgs *call_args,void *data)

{
  SyntaxTree *pSVar1;
  ExpVarData exp_var_data;
  ulong local_1c;
  undefined1 local_14;
  
  if (call_args->type_ == ExpList) {
    pSVar1 = (call_args->arg_)._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    if (pSVar1 != (SyntaxTree *)0x0) {
      local_1c = local_1c & 0xffffffff00000000;
      (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_1c);
      call_args->arg_value_count_ = (int)local_1c;
    }
  }
  else {
    local_1c = 1;
    local_14 = 0;
    (*((call_args->arg_)._M_t.
       super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
       super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
       super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl)->_vptr_SyntaxTree[2])();
    call_args->arg_value_count_ = 1;
  }
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(FuncCallArgs *call_args, void *data)
    {
        if (call_args->type_ == FuncCallArgs::ExpList)
        {
            if (call_args->arg_)
            {
                ExpListData exp_list_data;
                call_args->arg_->Accept(this, &exp_list_data);
                call_args->arg_value_count_ = exp_list_data.exp_value_count_;
            }
        }
        else
        {
            ExpVarData exp_var_data{ SemanticOp_Read };
            call_args->arg_->Accept(this, &exp_var_data);
            call_args->arg_value_count_ = 1;
        }
    }